

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O3

string * __thiscall
OpenMD::StringTokenizer::getRemainingString_abi_cxx11_
          (string *__return_storage_ptr__,StringTokenizer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ulong uVar4;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (this->currentPos_)._M_current;
  paVar3 = paVar1;
  if ((this->end_)._M_current != pcVar2) {
    do {
      uVar4 = (long)paVar3 - (long)paVar1;
      std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,uVar4,0,'\x01');
      pcVar2 = pcVar2 + 1;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(__return_storage_ptr__->_M_dataplus)._M_p;
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar1->_M_local_buf + uVar4 + 1);
    } while (pcVar2 != (this->end_)._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringTokenizer::getRemainingString() const {
    std::string result;
    std::string::const_iterator tmpIter = currentPos_;
    if (tmpIter != end_) {
      std::insert_iterator<std::string> insertIter(result, result.begin());

      while (tmpIter != end_) {
        *insertIter++ = *tmpIter++;
      }
    }

    return result;
  }